

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int getnumlimit(Header *h,char **fmt,int df)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  
  uVar5 = CONCAT44(in_register_00000014,df);
  if (0xfffffff5 < (int)**fmt - 0x3aU) {
    uVar5 = 0;
    pcVar1 = *fmt;
    do {
      pcVar3 = pcVar1 + 1;
      *fmt = pcVar3;
      uVar4 = ((int)*pcVar1 + (int)uVar5 * 10) - 0x30;
      uVar5 = (ulong)uVar4;
      if (9 < (int)*pcVar3 - 0x30U) break;
      pcVar1 = pcVar3;
    } while ((int)uVar4 < 0xccccccc);
  }
  if (0xffffffef < (int)uVar5 - 0x11U) {
    return (int)uVar5;
  }
  iVar2 = luaL_error(h->L,"integral size (%d) out of limits [1,%d]",uVar5,0x10);
  return iVar2;
}

Assistant:

static int getnum (const char **fmt, int df) {
  if (!digit(**fmt))  /* no number? */
    return df;  /* return default value */
  else {
    int a = 0;
    do {
      a = a*10 + (*((*fmt)++) - '0');
    } while (digit(**fmt) && a <= ((int)MAXSIZE - 9)/10);
    return a;
  }
}